

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

string * hmac_hash::sha1(string *__return_storage_ptr__,string *input)

{
  long lVar1;
  size_t i;
  char *__s;
  uint8_t digest [20];
  char buf [41];
  byte local_b8 [32];
  char local_98 [48];
  SHA1 local_68;
  
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    local_b8[lVar1] = 0;
  }
  local_68.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_h[0] = 0x67452301;
  local_68.m_h[1] = 0xefcdab89;
  local_68.m_h[2] = 0x98badcfe;
  local_68.m_h[3] = 0x10325476;
  local_68.m_h[4] = 0xc3d2e1f0;
  local_68.m_transforms = 0;
  SHA1::update(&local_68,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
  SHA1::finish(&local_68,local_b8);
  __s = local_98;
  local_98[0x20] = 0;
  local_98[0x21] = '\0';
  local_98[0x22] = '\0';
  local_98[0x23] = '\0';
  local_98[0x24] = '\0';
  local_98[0x25] = '\0';
  local_98[0x26] = '\0';
  local_98[0x27] = '\0';
  local_98[0x28] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0x18] = 0;
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    sprintf(__s,"%02x",(ulong)local_b8[lVar1]);
    __s = __s + 2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_98,local_98 + 0x28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_68.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string sha1(const std::string &input) {
        uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');

        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA1::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA1::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA1::DIGEST_SIZE; ++i) {
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA1::DIGEST_SIZE));
    }